

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_store_state(ALLEGRO_STATE *state,int flags)

{
  thread_local_state *ptVar1;
  ALLEGRO_BITMAP *pAVar2;
  uint in_ESI;
  int *in_RDI;
  ALLEGRO_BITMAP *target_1;
  ALLEGRO_BITMAP *target;
  INTERNAL_STATE *stored;
  thread_local_state *tls;
  size_t in_stack_ffffffffffffffb8;
  int *src;
  char *dest;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    in_RDI[0xb4] = in_ESI;
    if ((in_ESI & 1) != 0) {
      *in_RDI = ptVar1->new_display_flags;
      in_RDI[1] = ptVar1->new_display_refresh_rate;
      in_RDI[2] = ptVar1->new_display_adapter;
      in_RDI[3] = ptVar1->new_window_x;
      in_RDI[4] = ptVar1->new_window_y;
      memcpy(in_RDI + 8,&ptVar1->new_display_settings,0xb0);
      src = in_RDI + 0x49;
      dest = ptVar1->new_window_title;
      strlen(ptVar1->new_window_title);
      _al_sane_strncpy(dest,(char *)src,in_stack_ffffffffffffffb8);
    }
    if ((in_ESI & 2) != 0) {
      in_RDI[0x42] = ptVar1->new_bitmap_format;
      in_RDI[0x43] = ptVar1->new_bitmap_flags;
    }
    if ((in_ESI & 4) != 0) {
      *(ALLEGRO_DISPLAY **)(in_RDI + 0x34) = ptVar1->current_display;
    }
    if ((in_ESI & 8) != 0) {
      *(ALLEGRO_BITMAP **)(in_RDI + 0x36) = ptVar1->target_bitmap;
    }
    if ((in_ESI & 0x10) != 0) {
      memcpy(in_RDI + 0x8a,&ptVar1->current_blender,0x28);
    }
    if ((in_ESI & 0x20) != 0) {
      *(ALLEGRO_FILE_INTERFACE **)(in_RDI + 0x44) = ptVar1->new_file_interface;
      *(ALLEGRO_FS_INTERFACE **)(in_RDI + 0x46) = ptVar1->fs_interface;
    }
    if ((in_ESI & 0x40) != 0) {
      pAVar2 = al_get_target_bitmap();
      if (pAVar2 == (ALLEGRO_BITMAP *)0x0) {
        al_identity_transform((ALLEGRO_TRANSFORM *)(in_RDI + 0x94));
      }
      else {
        memcpy(in_RDI + 0x94,&pAVar2->transform,0x40);
      }
    }
    if (((in_ESI & 0x100) != 0) &&
       (pAVar2 = al_get_target_bitmap(), pAVar2 != (ALLEGRO_BITMAP *)0x0)) {
      memcpy(in_RDI + 0xa4,&pAVar2->proj_transform,0x40);
    }
  }
  return;
}

Assistant:

void al_store_state(ALLEGRO_STATE *state, int flags)
{
   thread_local_state *tls;
   INTERNAL_STATE *stored;

   if ((tls = tls_get()) == NULL)
      return;

   stored = (void *)state;
   stored->flags = flags;

#define _STORE(x) (stored->tls.x = tls->x)

   if (flags & ALLEGRO_STATE_NEW_DISPLAY_PARAMETERS) {
      _STORE(new_display_flags);
      _STORE(new_display_refresh_rate);
      _STORE(new_display_adapter);
      _STORE(new_window_x);
      _STORE(new_window_y);
      _STORE(new_display_settings);
      _al_sane_strncpy(stored->tls.new_window_title, tls->new_window_title,
                       strlen(tls->new_window_title));
   }

   if (flags & ALLEGRO_STATE_NEW_BITMAP_PARAMETERS) {
      _STORE(new_bitmap_format);
      _STORE(new_bitmap_flags);
   }

   if (flags & ALLEGRO_STATE_DISPLAY) {
      _STORE(current_display);
   }

   if (flags & ALLEGRO_STATE_TARGET_BITMAP) {
      _STORE(target_bitmap);
   }

   if (flags & ALLEGRO_STATE_BLENDER) {
      stored->stored_blender = tls->current_blender;
   }

   if (flags & ALLEGRO_STATE_NEW_FILE_INTERFACE) {
      _STORE(new_file_interface);
      _STORE(fs_interface);
   }

   if (flags & ALLEGRO_STATE_TRANSFORM) {
      ALLEGRO_BITMAP *target = al_get_target_bitmap();
      if (!target)
         al_identity_transform(&stored->stored_transform);
      else
         stored->stored_transform = target->transform;
   }

   if (flags & ALLEGRO_STATE_PROJECTION_TRANSFORM) {
      ALLEGRO_BITMAP *target = al_get_target_bitmap();
      if (target) {
         stored->stored_projection_transform = target->proj_transform;
      }
   }

#undef _STORE
}